

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRAM.c
# Opt level: O0

void debug_dump_VRAM(void)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  byte bVar9;
  byte bVar10;
  byte bVar11;
  byte bVar12;
  byte bVar13;
  byte bVar14;
  byte bVar15;
  byte bVar16;
  FILE *__stream;
  uint16_t address;
  uint local_3c;
  uint32_t addr;
  FILE *VRAM_dump;
  
  __stream = fopen("VRAM_dump.bin","w");
  if (__stream == (FILE *)0x0) {
    printf("ERROR: Could not open VRAM_dump.bin\n");
    exit(0);
  }
  for (local_3c = 0; local_3c < 0x4000; local_3c = local_3c + 0x10) {
    address = (uint16_t)local_3c;
    bVar1 = read_VRAM(address);
    bVar2 = read_VRAM(address + 1);
    bVar3 = read_VRAM(address + 2);
    bVar4 = read_VRAM(address + 3);
    bVar5 = read_VRAM(address + 4);
    bVar6 = read_VRAM(address + 5);
    bVar7 = read_VRAM(address + 6);
    bVar8 = read_VRAM(address + 7);
    bVar9 = read_VRAM(address + 8);
    bVar10 = read_VRAM(address + 9);
    bVar11 = read_VRAM(address + 10);
    bVar12 = read_VRAM(address + 0xb);
    bVar13 = read_VRAM(address + 0xc);
    bVar14 = read_VRAM(address + 0xd);
    bVar15 = read_VRAM(address + 0xe);
    bVar16 = read_VRAM(address + 0xf);
    fprintf(__stream,
            "%04x: %02x %02x %02x %02x %02x %02x %02x %02x %02x %02x %02x %02x %02x %02x %02x %02x\n"
            ,(ulong)local_3c,(ulong)bVar1,(ulong)bVar2,(ulong)bVar3,(uint)bVar4,(uint)bVar5,
            (uint)bVar6,(uint)bVar7,(uint)bVar8,(uint)bVar9,(uint)bVar10,(uint)bVar11,(uint)bVar12,
            (uint)bVar13,(uint)bVar14,(uint)bVar15,(uint)bVar16);
  }
  fclose(__stream);
  return;
}

Assistant:

void debug_dump_VRAM() {
    FILE* VRAM_dump = fopen("VRAM_dump.bin", "w");
    if(VRAM_dump == NULL) {
        printf("ERROR: Could not open VRAM_dump.bin\n");
        exit(0);
    }
    for(uint32_t addr = 0; addr < VRAM_SIZE; addr += 0x10) {
        fprintf(VRAM_dump, "%04x: %02x %02x %02x %02x %02x %02x %02x %02x %02x %02x %02x %02x %02x %02x %02x %02x\n",
                addr, read_VRAM(addr), read_VRAM(addr + 0x1), read_VRAM(addr + 0x2), read_VRAM(addr + 0x3), read_VRAM(addr + 0x4),
                read_VRAM(addr + 0x5), read_VRAM(addr + 0x6), read_VRAM(addr + 0x7), read_VRAM(addr + 0x8), read_VRAM(addr + 0x9),
                read_VRAM(addr + 0xA), read_VRAM(addr + 0xB), read_VRAM(addr + 0xC), read_VRAM(addr + 0xD), read_VRAM(addr + 0xE),
                read_VRAM(addr + 0xF));
    }
    fclose(VRAM_dump);
}